

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UBool __thiscall icu_63::Calendar::isWeekend(Calendar *this,UDate date,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UBool local_31;
  UBool result;
  Calendar *work;
  UErrorCode *status_local;
  UDate date_local;
  Calendar *this_local;
  Calendar *this_00;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = (*(this->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar2);
    if (this_00 == (Calendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      local_31 = '\0';
      setTime(this_00,date,status);
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 != '\0') {
        iVar2 = (*(this_00->super_UObject)._vptr_UObject[0x1b])();
        local_31 = (UBool)iVar2;
      }
      if (this_00 != (Calendar *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])();
      }
      this_local._7_1_ = local_31;
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
Calendar::isWeekend(UDate date, UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return FALSE;
    }
    // clone the calendar so we don't mess with the real one.
    Calendar *work = (Calendar*)this->clone();
    if (work == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    UBool result = FALSE;
    work->setTime(date, status);
    if (U_SUCCESS(status)) {
        result = work->isWeekend();
    }
    delete work;
    return result;
}